

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.cpp
# Opt level: O0

void test_qclab_dense_transpose<std::complex<float>>(void)

{
  bool bVar1;
  char *pcVar2;
  complex<float> in_RCX;
  complex<float> m01;
  complex<float> m01_00;
  complex<float> m01_01;
  complex<float> m01_02;
  complex<float> m01_03;
  complex<float> m01_04;
  complex<float> in_RSI;
  complex<float> in_R8;
  complex<float> in_R9;
  complex<float> in_stack_fffffffffffffaa8;
  complex<float> in_stack_fffffffffffffab0;
  complex<float> in_stack_fffffffffffffab8;
  AssertHelper local_4c8;
  Message local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_12;
  M m5_1;
  Message local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_11;
  M m4_1;
  Message local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_10;
  M m3_2;
  Message local_430;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_9;
  M m2_2;
  Message local_400;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_8;
  M m1_2;
  Message local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_7;
  M m5;
  Message local_3a0;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_6;
  M m4;
  Message local_370;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_5;
  M m3_1;
  Message local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_4;
  M m2_1;
  Message local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_3;
  M m1_1;
  Message local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_2;
  M m3;
  Message local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_1;
  M m2;
  Message local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar;
  M m1;
  complex<float> local_250;
  complex<float> local_248;
  complex<float> local_240;
  complex<float> local_238;
  complex<float> local_230;
  complex<float> local_228;
  complex<float> local_220;
  complex<float> local_218;
  complex<float> local_210;
  complex<float> local_208;
  complex<float> local_200;
  complex<float> local_1f8;
  complex<float> local_1f0;
  complex<float> local_1e8;
  complex<float> local_1e0;
  undefined1 local_1d8 [8];
  M check2T;
  complex<float> local_1c0;
  complex<float> local_1b8;
  complex<float> local_1b0;
  undefined1 local_1a8 [8];
  M check1T;
  complex<float> local_190;
  complex<float> local_188;
  complex<float> local_180;
  complex<float> local_178;
  complex<float> local_170;
  complex<float> local_168;
  complex<float> local_160;
  complex<float> local_158;
  complex<float> local_150;
  complex<float> local_148;
  complex<float> local_140;
  complex<float> local_138;
  complex<float> local_130;
  complex<float> local_128;
  complex<float> local_120;
  undefined1 local_118 [8];
  M check2;
  complex<float> local_100;
  complex<float> local_f8;
  complex<float> local_f0;
  undefined1 local_e8 [8];
  M check1;
  complex<float> local_d0;
  complex<float> local_c8;
  complex<float> local_c0;
  complex<float> local_b8;
  complex<float> local_b0;
  complex<float> local_a8;
  complex<float> local_a0;
  complex<float> local_94;
  complex<float> local_8c;
  complex<float> local_84;
  complex<float> local_7c;
  complex<float> local_74;
  complex<float> local_6c;
  complex<float> local_64 [2];
  complex<float> local_50;
  undefined1 local_48 [8];
  M matrix2;
  complex<float> local_30;
  complex<float> local_28;
  complex<float> local_20;
  undefined1 local_18 [8];
  M matrix1;
  
  std::complex<float>::complex(&local_20,1.0,0.0);
  std::complex<float>::complex(&local_28,2.0,0.0);
  std::complex<float>::complex(&local_30,3.0,0.0);
  std::complex<float>::complex((complex<float> *)&matrix2.data_,4.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_18,in_RSI,m01,in_RCX,in_R8);
  std::complex<float>::complex(&local_50,1.0,0.0);
  std::complex<float>::complex(local_64,5.0,0.0);
  std::complex<float>::complex(&local_6c,9.0,0.0);
  std::complex<float>::complex(&local_74,13.0,0.0);
  std::complex<float>::complex(&local_7c,2.0,0.0);
  std::complex<float>::complex(&local_84,6.0,0.0);
  std::complex<float>::complex(&local_8c,10.0,0.0);
  std::complex<float>::complex(&local_94,14.0,0.0);
  std::complex<float>::complex(&local_a0,3.0,0.0);
  std::complex<float>::complex(&local_a8,7.0,0.0);
  std::complex<float>::complex(&local_b0,11.0,0.0);
  std::complex<float>::complex(&local_b8,15.0,0.0);
  std::complex<float>::complex(&local_c0,4.0,0.0);
  std::complex<float>::complex(&local_c8,8.0,0.0);
  std::complex<float>::complex(&local_d0,12.0,0.0);
  std::complex<float>::complex((complex<float> *)&check1.data_,16.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_48,in_RSI,m01_00,local_a0,in_R8,in_R9,
             local_a0,local_a8,local_b0,local_b8,local_c0,local_c8,local_d0,
             (complex<float>)
             check1.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl,
             in_stack_fffffffffffffaa8,in_stack_fffffffffffffab0,in_stack_fffffffffffffab8);
  std::complex<float>::complex(&local_f0,1.0,0.0);
  std::complex<float>::complex(&local_f8,2.0,0.0);
  std::complex<float>::complex(&local_100,3.0,0.0);
  std::complex<float>::complex((complex<float> *)&check2.data_,4.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_e8,in_RSI,m01_01,local_a0,in_R8);
  std::complex<float>::complex(&local_120,1.0,0.0);
  std::complex<float>::complex(&local_128,5.0,0.0);
  std::complex<float>::complex(&local_130,9.0,0.0);
  std::complex<float>::complex(&local_138,13.0,0.0);
  std::complex<float>::complex(&local_140,2.0,0.0);
  std::complex<float>::complex(&local_148,6.0,0.0);
  std::complex<float>::complex(&local_150,10.0,0.0);
  std::complex<float>::complex(&local_158,14.0,0.0);
  std::complex<float>::complex(&local_160,3.0,0.0);
  std::complex<float>::complex(&local_168,7.0,0.0);
  std::complex<float>::complex(&local_170,11.0,0.0);
  std::complex<float>::complex(&local_178,15.0,0.0);
  std::complex<float>::complex(&local_180,4.0,0.0);
  std::complex<float>::complex(&local_188,8.0,0.0);
  std::complex<float>::complex(&local_190,12.0,0.0);
  std::complex<float>::complex((complex<float> *)&check1T.data_,16.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_118,in_RSI,m01_02,local_160,in_R8,in_R9,
             local_160,local_168,local_170,local_178,local_180,local_188,local_190,
             (complex<float>)
             check1T.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl,
             in_stack_fffffffffffffaa8,in_stack_fffffffffffffab0,in_stack_fffffffffffffab8);
  std::complex<float>::complex(&local_1b0,1.0,0.0);
  std::complex<float>::complex(&local_1b8,3.0,0.0);
  std::complex<float>::complex(&local_1c0,2.0,0.0);
  std::complex<float>::complex((complex<float> *)&check2T.data_,4.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1a8,in_RSI,m01_03,local_160,in_R8);
  std::complex<float>::complex(&local_1e0,1.0,0.0);
  std::complex<float>::complex(&local_1e8,2.0,0.0);
  std::complex<float>::complex(&local_1f0,3.0,0.0);
  std::complex<float>::complex(&local_1f8,4.0,0.0);
  std::complex<float>::complex(&local_200,5.0,0.0);
  std::complex<float>::complex(&local_208,6.0,0.0);
  std::complex<float>::complex(&local_210,7.0,0.0);
  std::complex<float>::complex(&local_218,8.0,0.0);
  std::complex<float>::complex(&local_220,9.0,0.0);
  std::complex<float>::complex(&local_228,10.0,0.0);
  std::complex<float>::complex(&local_230,11.0,0.0);
  std::complex<float>::complex(&local_238,12.0,0.0);
  std::complex<float>::complex(&local_240,13.0,0.0);
  std::complex<float>::complex(&local_248,14.0,0.0);
  std::complex<float>::complex(&local_250,15.0,0.0);
  std::complex<float>::complex((complex<float> *)&m1.data_,16.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1d8,in_RSI,m01_04,local_220,in_R8,in_R9,
             local_220,local_228,local_230,local_238,local_240,local_248,local_250,
             (complex<float>)
             m1.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl,
             in_stack_fffffffffffffaa8,in_stack_fffffffffffffab0,in_stack_fffffffffffffab8);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar.message_,
             (SquareMatrix<std::complex<float>_> *)local_18);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (NoTrans,(SquareMatrix<std::complex<float>_> *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_278,"m1","check1",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar.message_,
             (SquareMatrix<std::complex<float>_> *)local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2.data_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2.data_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_1.message_,
             (SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (NoTrans,(SquareMatrix<std::complex<float>_> *)&gtest_ar_1.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_2a8,"m2","check2",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_1.message_,
             (SquareMatrix<std::complex<float>_> *)local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3.data_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3.data_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  qclab::dense::operate<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&gtest_ar_2.message_,NoTrans,(SquareMatrix<std::complex<float>_> *)local_48);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_2d8,"m3","check2",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_2.message_,
             (SquareMatrix<std::complex<float>_> *)local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m1_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m1_1.data_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m1_1.data_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_2.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_1.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_3.message_,
             (SquareMatrix<std::complex<float>_> *)local_18);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (Trans,(SquareMatrix<std::complex<float>_> *)&gtest_ar_3.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_308,"m1","check1T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_3.message_,
             (SquareMatrix<std::complex<float>_> *)local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2_1.data_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2_1.data_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_4.message_,
             (SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (Trans,(SquareMatrix<std::complex<float>_> *)&gtest_ar_4.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_338,"m2","check2T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_4.message_,
             (SquareMatrix<std::complex<float>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3_1.data_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3_1.data_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  qclab::dense::operate<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&gtest_ar_5.message_,Trans,(SquareMatrix<std::complex<float>_> *)local_48);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_368,"m3","check2T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_5.message_,
             (SquareMatrix<std::complex<float>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m4.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m4.data_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m4.data_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_6.message_,
             (SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::transInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_6.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_398,"m4","check2T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_6.message_,
             (SquareMatrix<std::complex<float>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5.data_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5.data_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&gtest_ar_7.message_,(SquareMatrix<std::complex<float>_> *)local_48);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_3c8,"m5","check2T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_7.message_,
             (SquareMatrix<std::complex<float>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m1_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m1_2.data_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m1_2.data_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_7.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_6.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_5.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_4.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_3.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_8.message_,
             (SquareMatrix<std::complex<float>_> *)local_18);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (ConjTrans,(SquareMatrix<std::complex<float>_> *)&gtest_ar_8.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_3f8,"m1","check1T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_8.message_,
             (SquareMatrix<std::complex<float>_> *)local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2_2.data_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2_2.data_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_9.message_,
             (SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (ConjTrans,(SquareMatrix<std::complex<float>_> *)&gtest_ar_9.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_428,"m2","check2T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_9.message_,
             (SquareMatrix<std::complex<float>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3_2.data_,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3_2.data_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  qclab::dense::operate<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&gtest_ar_10.message_,ConjTrans,(SquareMatrix<std::complex<float>_> *)local_48
            );
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_458,"m3","check2T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_10.message_,
             (SquareMatrix<std::complex<float>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m4_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m4_1.data_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m4_1.data_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_11.message_,
             (SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::conjTransInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_11.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_488,"m4","check2T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_11.message_,
             (SquareMatrix<std::complex<float>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5_1.data_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5_1.data_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  qclab::dense::conjTrans<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&gtest_ar_12.message_,(SquareMatrix<std::complex<float>_> *)local_48);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_4b8,"m5","check2T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_12.message_,
             (SquareMatrix<std::complex<float>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper(&local_4c8);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_12.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_11.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_10.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_9.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_8.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1d8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1a8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_118);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_e8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_18);
  return;
}

Assistant:

void test_qclab_dense_transpose() {

  using M = qclab::dense::SquareMatrix< T > ;

  M matrix1( 1 , 2 ,
             3 , 4 ) ;
  M matrix2( 1 , 5 ,  9 , 13 ,
             2 , 6 , 10 , 14 ,
             3 , 7 , 11 , 15 ,
             4 , 8 , 12 , 16 ) ;

  M check1( 1 , 2 ,
            3 , 4 ) ;
  M check2( 1 , 5 ,  9 , 13 ,
            2 , 6 , 10 , 14 ,
            3 , 7 , 11 , 15 ,
            4 , 8 , 12 , 16 ) ;

  M check1T( 1 , 3 ,
             2 , 4 ) ;
  M check2T(  1 ,  2 ,  3 ,  4 ,
              5 ,  6 ,  7 ,  8 ,
              9 , 10 , 11 , 12 ,
             13 , 14 , 15 , 16 ) ;

  // NoTrans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::NoTrans , m1 ) ;
    EXPECT_EQ( m1 , check1 ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::NoTrans , m2 ) ;
    EXPECT_EQ( m2 , check2 ) ;
    M m3 = qclab::dense::operate( qclab::Op::NoTrans , matrix2 ) ;
    EXPECT_EQ( m3 , check2 ) ;
  }

  // Trans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::Trans , m1 ) ;
    EXPECT_EQ( m1 , check1T ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::Trans , m2 ) ;
    EXPECT_EQ( m2 , check2T ) ;
    M m3 = qclab::dense::operate( qclab::Op::Trans , matrix2 ) ;
    EXPECT_EQ( m3 , check2T ) ;
    M m4( matrix2 ) ;
    qclab::dense::transInPlace( m4 ) ;
    EXPECT_EQ( m4 , check2T ) ;
    M m5 = qclab::dense::trans( matrix2 ) ;
    EXPECT_EQ( m5 , check2T ) ;
  }

  // ConjTrans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::ConjTrans , m1 ) ;
    EXPECT_EQ( m1 , check1T ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::ConjTrans , m2 ) ;
    EXPECT_EQ( m2 , check2T ) ;
    M m3 = qclab::dense::operate( qclab::Op::ConjTrans , matrix2 ) ;
    EXPECT_EQ( m3 , check2T ) ;
    M m4( matrix2 ) ;
    qclab::dense::conjTransInPlace( m4 ) ;
    EXPECT_EQ( m4 , check2T ) ;
    M m5 = qclab::dense::conjTrans( matrix2 ) ;
    EXPECT_EQ( m5 , check2T ) ;
  }

}